

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t
spvtools::val::StructuredControlFlowChecks
          (ValidationState_t *_,Function *function,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *back_edges,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  pointer ppVar1;
  pointer ppBVar2;
  Construct *this;
  bool bVar3;
  ConstructType CVar4;
  uint uVar5;
  spv_result_t sVar6;
  _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar7;
  mapped_type *pmVar8;
  Instruction *pIVar9;
  _List_node_base *p_Var10;
  BasicBlock *pBVar11;
  BasicBlock *pBVar12;
  size_type sVar13;
  Instruction *pIVar14;
  pointer ppVar15;
  ConstructType type;
  ConstructType type_00;
  _List_node_base *p_Var16;
  uint32_t merge_block_id;
  char *__s;
  byte bVar17;
  pointer ppBVar18;
  pair<spvtools::val::BasicBlock_*,_bool> pVar19;
  spv_result_t local_40c;
  uint32_t loop_header_id;
  undefined4 uStack_3ec;
  BasicBlock *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  uint32_t back_edge_block;
  undefined4 uStack_3cc;
  undefined8 local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  BasicBlock *pred;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  BasicBlock *local_390;
  Instruction *local_388;
  uint32_t header_block;
  undefined4 uStack_37c;
  BasicBlock *local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  ConstructBlockSet construct_blocks;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__range6;
  BasicBlock *merge_block;
  BasicBlock *succ;
  string local_2d8;
  map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  loop_latch_blocks;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  DiagnosticStream local_208;
  
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header;
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar1 = (back_edges->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       loop_latch_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppVar15 = (back_edges->
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar1;
      ppVar15 = ppVar15 + 1) {
    back_edge_block = (*ppVar15).first;
    merge_block_id = (*ppVar15).second;
    header_block = merge_block_id;
    bVar3 = Function::IsBlockType(function,merge_block_id,kBlockTypeLoop);
    if (!bVar3) {
      pIVar9 = ValidationState_t::FindDef(_,back_edge_block);
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
      std::operator<<((ostream *)&local_208,"Back-edges (");
      ValidationState_t::getIdName_abi_cxx11_((string *)&construct_blocks,_,back_edge_block);
      std::operator<<((ostream *)&local_208,(string *)&construct_blocks);
      std::operator<<((ostream *)&local_208," -> ");
      ValidationState_t::getIdName_abi_cxx11_((string *)&loop_header_id,_,header_block);
      std::operator<<((ostream *)&local_208,(string *)&loop_header_id);
      std::operator<<((ostream *)&local_208,
                      ") can only be formed between a block and a loop header.");
      local_40c = local_208.error_;
      std::__cxx11::string::_M_dispose();
      goto LAB_001a6a36;
    }
    this_00 = (_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)std::
                 map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::operator[](&loop_latch_blocks,&header_block);
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert(this_00,&back_edge_block);
  }
  pvVar7 = Function::ordered_blocks(function);
  ppBVar18 = (pvVar7->
             super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (pvVar7->
            super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
LAB_001a693a:
  if (ppBVar18 != ppBVar2) {
    pBVar11 = *ppBVar18;
    if ((pBVar11->structurally_reachable_ != true) ||
       (bVar3 = std::bitset<7UL>::test(&pBVar11->type_,2), !bVar3)) goto LAB_001a6980;
    loop_header_id = pBVar11->id_;
    pmVar8 = std::
             map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&loop_latch_blocks,&loop_header_id);
    if ((pmVar8->_M_h)._M_element_count == 1) goto LAB_001a6980;
    pIVar9 = ValidationState_t::FindDef(_,loop_header_id);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
    std::operator<<((ostream *)&local_208,"Loop header ");
    ValidationState_t::getIdName_abi_cxx11_((string *)&construct_blocks,_,loop_header_id);
    std::operator<<((ostream *)&local_208,(string *)&construct_blocks);
    std::operator<<((ostream *)&local_208," is targeted by ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::operator<<((ostream *)&local_208," back-edge blocks but the standard requires exactly one")
    ;
    local_40c = local_208.error_;
LAB_001a6a36:
    std::__cxx11::string::_M_dispose();
    goto LAB_001a6a3e;
  }
  p_Var10 = (_List_node_base *)Function::constructs_abi_cxx11_(function);
  p_Var16 = p_Var10;
  while( true ) {
    do {
      p_Var16 = (((_List_base<spvtools::val::Construct,_std::allocator<spvtools::val::Construct>_> *
                  )&p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var16 == p_Var10) {
        local_40c = ValidateStructuredSelections(_,postorder);
        goto LAB_001a7228;
      }
      this = (Construct *)(p_Var16 + 1);
      pBVar11 = Construct::entry_block(this);
    } while (pBVar11->structurally_reachable_ != true);
    pBVar12 = Construct::exit_block(this);
    if (pBVar12 == (BasicBlock *)0x0) {
      construct_blocks._M_t._M_impl._0_8_ =
           &construct_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      construct_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      construct_blocks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      _loop_header_id = (pointer)&local_3e0;
      local_3e8 = (BasicBlock *)0x0;
      construct_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ = 0;
      local_3e0._M_local_buf[0] = '\0';
      local_3c8 = 0;
      local_3c0._M_local_buf[0] = '\0';
      _back_edge_block = &local_3c0;
      CVar4 = Construct::type(this);
      ConstructNames_abi_cxx11_
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,(val *)(ulong)CVar4,type_00);
      _header_block = (pointer)&back_edge_block;
      local_378 = (BasicBlock *)&loop_header_id;
      local_370._M_allocated_capacity =
           (size_type)
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&construct_blocks;
      std::_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
      _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                  *)&header_block,
                 (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_208);
      pIVar9 = ValidationState_t::FindDef(_,pBVar11->id_);
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INTERNAL,pIVar9);
      std::operator+(&local_268,"Construct ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &construct_blocks);
      std::operator+(&local_248,&local_268," with ");
      std::operator+(&local_228,&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &loop_header_id);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &merge_block,&local_228," ");
      ValidationState_t::getIdName_abi_cxx11_(&local_288,_,pBVar11->id_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&succ,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &merge_block,&local_288);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&succ,
                     " does not have a ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pred,
                     &local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &back_edge_block);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &header_block,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pred,
                     ". This may be a bug in the validator.");
      std::operator<<((ostream *)&local_208,(string *)&header_block);
      local_40c = local_208.error_;
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream(&local_208);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_001a7228;
    }
    bVar3 = BasicBlock::structurally_dominates(pBVar11,pBVar12);
    if (!bVar3) break;
    if ((pBVar11 == pBVar12) && ((this->type_ & 0xfffffffd) == 1)) {
      pIVar9 = ValidationState_t::FindDef(_,pBVar12->id_);
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
      ValidationState_t::getIdName_abi_cxx11_((string *)&loop_header_id,_,pBVar11->id_);
      ValidationState_t::getIdName_abi_cxx11_((string *)&back_edge_block,_,pBVar12->id_);
      __s = "does not strictly structurally dominate";
LAB_001a7652:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header_block,__s,(allocator<char> *)&pred);
      ConstructErrorString
                ((string *)&construct_blocks,this,(string *)&loop_header_id,
                 (string *)&back_edge_block,(string *)&header_block);
      goto LAB_001a7683;
    }
    local_390 = pBVar12;
    CVar4 = Construct::type(this);
    if ((CVar4 == kContinue) &&
       (bVar3 = BasicBlock::structurally_postdominates(local_390,pBVar11), pBVar12 = local_390,
       !bVar3)) {
      pIVar9 = ValidationState_t::FindDef(_,local_390->id_);
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
      ValidationState_t::getIdName_abi_cxx11_((string *)&loop_header_id,_,pBVar11->id_);
      ValidationState_t::getIdName_abi_cxx11_((string *)&back_edge_block,_,pBVar12->id_);
      __s = "is not structurally post dominated by";
      goto LAB_001a7652;
    }
    Construct::blocks(&construct_blocks,this,function);
    _loop_header_id = (pointer)&local_3e0;
    local_3e8 = (BasicBlock *)0x0;
    _back_edge_block = &local_3c0;
    local_3c8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    local_3c0._M_local_buf[0] = '\0';
    _header_block = (pointer)&local_370;
    local_378 = (BasicBlock *)0x0;
    local_370._M_allocated_capacity = local_370._M_allocated_capacity & 0xffffffffffffff00;
    CVar4 = Construct::type(this);
    ConstructNames_abi_cxx11_
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_208,(val *)(ulong)CVar4,type);
    pred = (BasicBlock *)&header_block;
    local_3a0._M_allocated_capacity = (size_type)&loop_header_id;
    local_3a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&back_edge_block;
    std::_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::
    _M_assign<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              ((_Tuple_impl<0ul,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&> *
               )&pred,(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_208);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208);
    pIVar9 = (Instruction *)construct_blocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pIVar9 != (Instruction *)&construct_blocks._M_t._M_impl.super__Rb_tree_header) {
      pBVar12 = (BasicBlock *)
                (pIVar9->operands_).
                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppBVar2 = (pBVar12->successors_).
                super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_388 = pIVar9;
      for (ppBVar18 = (pBVar12->successors_).
                      super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar18 != ppBVar2;
          ppBVar18 = ppBVar18 + 1) {
        succ = *ppBVar18;
        sVar13 = std::
                 set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                 ::count(&construct_blocks,&succ);
        if ((sVar13 == 0) && (bVar3 = Construct::IsStructuredExit(this,_,succ), !bVar3)) {
          pIVar9 = ValidationState_t::FindDef(_,pBVar12->id_);
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
          std::operator<<((ostream *)&local_208,"block <ID> ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&pred,_,pBVar12->id_);
          std::operator<<((ostream *)&local_208,(string *)&pred);
          std::operator<<((ostream *)&local_208," exits the ");
          std::operator<<((ostream *)&local_208,(string *)&loop_header_id);
          std::operator<<((ostream *)&local_208," headed by <ID> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_2d8,_,pBVar11->id_);
          std::operator<<((ostream *)&local_208,(string *)&local_2d8);
          std::operator<<((ostream *)&local_208,", but not via a structured exit");
          local_40c = local_208.error_;
          std::__cxx11::string::_M_dispose();
          goto LAB_001a6dbe;
        }
      }
      if (pBVar12 != pBVar11) {
        ppBVar2 = (pBVar12->predecessors_).
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar18 = (pBVar12->predecessors_).
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppBVar18 != ppBVar2;
            ppBVar18 = ppBVar18 + 1) {
          pred = *ppBVar18;
          if ((pred->structurally_reachable_ == true) &&
             (sVar13 = std::
                       set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                       ::count(&construct_blocks,&pred), sVar13 == 0)) {
            pIVar9 = ValidationState_t::FindDef(_,pred->id_);
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
            std::operator<<((ostream *)&local_208,"block <ID> ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::operator<<((ostream *)&local_208," branches to the ");
            std::operator<<((ostream *)&local_208,(string *)&loop_header_id);
            std::operator<<((ostream *)&local_208," construct, but not to the ");
            std::operator<<((ostream *)&local_208,(string *)&back_edge_block);
            std::operator<<((ostream *)&local_208," <ID> ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            local_40c = local_208.error_;
            DiagnosticStream::~DiagnosticStream(&local_208);
            goto LAB_001a6e90;
          }
        }
        bVar3 = std::bitset<7UL>::test(&pBVar12->type_,1);
        if (((bVar3) || (bVar3 = std::bitset<7UL>::test(&pBVar12->type_,2), bVar3)) &&
           ((pBVar12->terminator_[-1].inst_.opcode & 0xfffe) == 0xf6)) {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(pBVar12->terminator_ + -1,0);
          pVar19 = Function::GetBlock(function,uVar5);
          merge_block = pVar19.first;
          if ((merge_block->structurally_reachable_ == true) &&
             (sVar13 = std::
                       set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                       ::count(&construct_blocks,&merge_block), sVar13 == 0)) {
            pIVar9 = ValidationState_t::FindDef(_,pBVar12->id_);
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
            std::operator<<((ostream *)&local_208,"Header block ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&pred,_,pBVar12->id_);
            std::operator<<((ostream *)&local_208,(string *)&pred);
            std::operator<<((ostream *)&local_208," is contained in the ");
            std::operator<<((ostream *)&local_208,(string *)&loop_header_id);
            std::operator<<((ostream *)&local_208," construct headed by ");
            ValidationState_t::getIdName_abi_cxx11_(&local_2d8,_,pBVar11->id_);
            std::operator<<((ostream *)&local_208,(string *)&local_2d8);
            std::operator<<((ostream *)&local_208,", but its merge block ");
            ValidationState_t::getIdName_abi_cxx11_((string *)&succ,_,uVar5);
            std::operator<<((ostream *)&local_208,(string *)&succ);
            std::operator<<((ostream *)&local_208," is not");
            local_40c = local_208.error_;
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
LAB_001a6dbe:
            std::__cxx11::string::_M_dispose();
            DiagnosticStream::~DiagnosticStream(&local_208);
            goto LAB_001a6e90;
          }
        }
      }
      pIVar9 = (Instruction *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_388);
    }
    CVar4 = Construct::type(this);
    if (CVar4 == kLoop) {
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pBVar11->terminator_ + -1,1);
      pIVar9 = ValidationState_t::FindDef(_,uVar5);
      if (pBVar11->id_ != uVar5) {
        pIVar14 = (Instruction *)
                  ((pIVar9[1].block_)->predecessors_).
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar9 = (Instruction *)
                 ((pIVar9[1].block_)->predecessors_).
                 super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
LAB_001a6f7f:
        if (pIVar14 != pIVar9) {
          merge_block = (BasicBlock *)
                        (pIVar14->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          bVar17 = 0;
          for (ppVar15 = (back_edges->
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              ppVar15 !=
              (back_edges->
              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              )._M_impl.super__Vector_impl_data._M_finish; ppVar15 = ppVar15 + 1) {
            if (uVar5 == (*ppVar15).second) {
              bVar17 = bVar17 | merge_block->id_ == (*ppVar15).first;
            }
          }
          local_388 = pIVar14;
          sVar13 = std::
                   set<spvtools::val::BasicBlock_*,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
                   ::count(&construct_blocks,&merge_block);
          if ((bool)(sVar13 != 0 | bVar17)) goto code_r0x001a6ff3;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,merge_block->terminator_);
          std::operator<<((ostream *)&local_208,"Block ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&pred,_,merge_block->id_);
          std::operator<<((ostream *)&local_208,(string *)&pred);
          std::operator<<((ostream *)&local_208," branches to the loop continue target ");
          ValidationState_t::getIdName_abi_cxx11_(&local_2d8,_,uVar5);
          std::operator<<((ostream *)&local_208,(string *)&local_2d8);
          std::operator<<((ostream *)&local_208,
                          ", but is not contained in the associated loop construct ");
          ValidationState_t::getIdName_abi_cxx11_((string *)&succ,_,pBVar11->id_);
          std::operator<<((ostream *)&local_208,(string *)&succ);
          local_40c = local_208.error_;
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001a6e90:
          bVar3 = false;
          goto LAB_001a6e95;
        }
      }
    }
    CVar4 = Construct::type(this);
    bVar3 = true;
    if ((CVar4 == kSelection) && ((pBVar11->terminator_->inst_).opcode == 0xfb)) {
      sVar6 = StructuredSwitchChecks(_,function,pBVar11->terminator_,pBVar11,local_390);
      bVar3 = sVar6 == SPV_SUCCESS;
      if (!bVar3) {
        local_40c = sVar6;
      }
    }
LAB_001a6e95:
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::
    _Rb_tree<spvtools::val::BasicBlock_*,_spvtools::val::BasicBlock_*,_std::_Identity<spvtools::val::BasicBlock_*>,_spvtools::val::less_than_id,_std::allocator<spvtools::val::BasicBlock_*>_>
    ::~_Rb_tree(&construct_blocks._M_t);
    if (!bVar3) goto LAB_001a7228;
  }
  pIVar9 = ValidationState_t::FindDef(_,pBVar12->id_);
  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CFG,pIVar9);
  ValidationState_t::getIdName_abi_cxx11_((string *)&loop_header_id,_,pBVar11->id_);
  ValidationState_t::getIdName_abi_cxx11_((string *)&back_edge_block,_,pBVar12->id_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header_block,"does not structurally dominate",(allocator<char> *)&pred);
  ConstructErrorString
            ((string *)&construct_blocks,this,(string *)&loop_header_id,(string *)&back_edge_block,
             (string *)&header_block);
LAB_001a7683:
  std::operator<<((ostream *)&local_208,(string *)&construct_blocks);
  local_40c = local_208.error_;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
LAB_001a6a3e:
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001a7228:
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&loop_latch_blocks._M_t);
  return local_40c;
LAB_001a6980:
  ppBVar18 = ppBVar18 + 1;
  goto LAB_001a693a;
code_r0x001a6ff3:
  pIVar14 = (Instruction *)
            &(local_388->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  goto LAB_001a6f7f;
}

Assistant:

spv_result_t StructuredControlFlowChecks(
    ValidationState_t& _, Function* function,
    const std::vector<std::pair<uint32_t, uint32_t>>& back_edges,
    const std::vector<const BasicBlock*>& postorder) {
  /// Check all backedges target only loop headers and have exactly one
  /// back-edge branching to it

  // Map a loop header to blocks with back-edges to the loop header.
  std::map<uint32_t, std::unordered_set<uint32_t>> loop_latch_blocks;
  for (auto back_edge : back_edges) {
    uint32_t back_edge_block;
    uint32_t header_block;
    std::tie(back_edge_block, header_block) = back_edge;
    if (!function->IsBlockType(header_block, kBlockTypeLoop)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(back_edge_block))
             << "Back-edges (" << _.getIdName(back_edge_block) << " -> "
             << _.getIdName(header_block)
             << ") can only be formed between a block and a loop header.";
    }
    loop_latch_blocks[header_block].insert(back_edge_block);
  }

  // Check the loop headers have exactly one back-edge branching to it
  for (BasicBlock* loop_header : function->ordered_blocks()) {
    if (!loop_header->structurally_reachable()) continue;
    if (!loop_header->is_type(kBlockTypeLoop)) continue;
    auto loop_header_id = loop_header->id();
    auto num_latch_blocks = loop_latch_blocks[loop_header_id].size();
    if (num_latch_blocks != 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(loop_header_id))
             << "Loop header " << _.getIdName(loop_header_id)
             << " is targeted by " << num_latch_blocks
             << " back-edge blocks but the standard requires exactly one";
    }
  }

  // Check construct rules
  for (const Construct& construct : function->constructs()) {
    auto header = construct.entry_block();
    if (!header->structurally_reachable()) continue;
    auto merge = construct.exit_block();

    if (!merge) {
      std::string construct_name, header_name, exit_name;
      std::tie(construct_name, header_name, exit_name) =
          ConstructNames(construct.type());
      return _.diag(SPV_ERROR_INTERNAL, _.FindDef(header->id()))
             << "Construct " + construct_name + " with " + header_name + " " +
                    _.getIdName(header->id()) + " does not have a " +
                    exit_name + ". This may be a bug in the validator.";
    }

    // If the header is reachable, the merge is guaranteed to be structurally
    // reachable.
    if (!header->structurally_dominates(*merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not structurally dominate");
    }

    // If it's really a merge block for a selection or loop, then it must be
    // *strictly* structrually dominated by the header.
    if (construct.ExitBlockIsMergeBlock() && (header == merge)) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
             << ConstructErrorString(construct, _.getIdName(header->id()),
                                     _.getIdName(merge->id()),
                                     "does not strictly structurally dominate");
    }

    // Check post-dominance for continue constructs.  But dominance and
    // post-dominance only make sense when the construct is reachable.
    if (construct.type() == ConstructType::kContinue) {
      if (!merge->structurally_postdominates(*header)) {
        return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(merge->id()))
               << ConstructErrorString(construct, _.getIdName(header->id()),
                                       _.getIdName(merge->id()),
                                       "is not structurally post dominated by");
      }
    }

    Construct::ConstructBlockSet construct_blocks = construct.blocks(function);
    std::string construct_name, header_name, exit_name;
    std::tie(construct_name, header_name, exit_name) =
        ConstructNames(construct.type());
    for (auto block : construct_blocks) {
      // Check that all exits from the construct are via structured exits.
      for (auto succ : *block->successors()) {
        if (!construct_blocks.count(succ) &&
            !construct.IsStructuredExit(_, succ)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                 << "block <ID> " << _.getIdName(block->id()) << " exits the "
                 << construct_name << " headed by <ID> "
                 << _.getIdName(header->id())
                 << ", but not via a structured exit";
        }
      }
      if (block == header) continue;
      // Check that for all non-header blocks, all predecessors are within this
      // construct.
      for (auto pred : *block->predecessors()) {
        if (pred->structurally_reachable() && !construct_blocks.count(pred)) {
          return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pred->id()))
                 << "block <ID> " << pred->id() << " branches to the "
                 << construct_name << " construct, but not to the "
                 << header_name << " <ID> " << header->id();
        }
      }

      if (block->is_type(BlockType::kBlockTypeSelection) ||
          block->is_type(BlockType::kBlockTypeLoop)) {
        size_t index = (block->terminator() - &_.ordered_instructions()[0]) - 1;
        const auto& merge_inst = _.ordered_instructions()[index];
        if (merge_inst.opcode() == spv::Op::OpSelectionMerge ||
            merge_inst.opcode() == spv::Op::OpLoopMerge) {
          uint32_t merge_id = merge_inst.GetOperandAs<uint32_t>(0);
          auto merge_block = function->GetBlock(merge_id).first;
          if (merge_block->structurally_reachable() &&
              !construct_blocks.count(merge_block)) {
            return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(block->id()))
                   << "Header block " << _.getIdName(block->id())
                   << " is contained in the " << construct_name
                   << " construct headed by " << _.getIdName(header->id())
                   << ", but its merge block " << _.getIdName(merge_id)
                   << " is not";
          }
        }
      }
    }

    if (construct.type() == ConstructType::kLoop) {
      // If the continue target differs from the loop header, then check that
      // all edges into the continue construct come from within the loop.
      const auto index = header->terminator() - &_.ordered_instructions()[0];
      const auto& merge_inst = _.ordered_instructions()[index - 1];
      const auto continue_id = merge_inst.GetOperandAs<uint32_t>(1);
      const auto* continue_inst = _.FindDef(continue_id);
      // OpLabel instructions aren't stored as part of the basic block for
      // legacy reaasons. Grab the next instruction and use it's block pointer
      // instead.
      const auto next_index =
          (continue_inst - &_.ordered_instructions()[0]) + 1;
      const auto& next_inst = _.ordered_instructions()[next_index];
      const auto* continue_target = next_inst.block();
      if (header->id() != continue_id) {
        for (auto pred : *continue_target->predecessors()) {
          // Ignore back-edges from within the continue construct.
          bool is_back_edge = false;
          for (auto back_edge : back_edges) {
            uint32_t back_edge_block;
            uint32_t header_block;
            std::tie(back_edge_block, header_block) = back_edge;
            if (header_block == continue_id && back_edge_block == pred->id())
              is_back_edge = true;
          }
          if (!construct_blocks.count(pred) && !is_back_edge) {
            return _.diag(SPV_ERROR_INVALID_CFG, pred->terminator())
                   << "Block " << _.getIdName(pred->id())
                   << " branches to the loop continue target "
                   << _.getIdName(continue_id)
                   << ", but is not contained in the associated loop construct "
                   << _.getIdName(header->id());
          }
        }
      }
    }

    // Checks rules for case constructs.
    if (construct.type() == ConstructType::kSelection &&
        header->terminator()->opcode() == spv::Op::OpSwitch) {
      const auto terminator = header->terminator();
      if (auto error =
              StructuredSwitchChecks(_, function, terminator, header, merge)) {
        return error;
      }
    }
  }

  if (auto error = ValidateStructuredSelections(_, postorder)) {
    return error;
  }

  return SPV_SUCCESS;
}